

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O1

value_type * __thiscall
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::ToString,test::LargeEnumClass>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,LargeEnumClass *in)

{
  uint *puVar1;
  long lVar2;
  string_view full_tag;
  string_view tag_00;
  InputStream istream;
  ToString visitor;
  cx_string<100UL> tag;
  stringstream stream;
  InputStream local_3a8;
  undefined8 local_3a0 [2];
  long local_390;
  uint auStack_378 [22];
  ios_base aiStack_320 [267];
  char local_215 [101];
  long local_1b0 [2];
  char local_1a0 [12];
  undefined4 auStack_194 [25];
  ios_base aiStack_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  lVar2 = *(long *)(local_1b0[0] + -0x18);
  *(undefined4 *)((long)auStack_194 + lVar2) = 4;
  std::ios::clear((int)local_3a0 + (int)lVar2 + 0x1f0);
  local_3a0[0] = *(undefined8 *)this;
  std::ostream::write(local_1a0,(long)local_3a0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3a0);
  puVar1 = (uint *)((long)auStack_378 + *(long *)(local_390 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_3a8.stream = (stringstream *)local_1b0;
  mserialize::CustomTag<test::LargeEnumClass,_void>::tag_string();
  full_tag._len = 100;
  full_tag._ptr = local_215;
  tag_00._len = 100;
  tag_00._ptr = local_215;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_3a0,&local_3a8,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
  std::ios_base::~ios_base(aiStack_320);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  return __return_storage_ptr__;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}